

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *pInfo;
  Aig_Obj_t *pObj_00;
  int *piVar5;
  uint Value;
  
  pInfo = (uint *)Vec_PtrEntry(p->vTerInfo,iFrame);
  Value = pInfo[pObj->Id >> 4] >> ((char)pObj->Id * '\x02' & 0x1fU) & 3;
  if (Value == 0) {
    if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
      uVar1 = Saig_ManBmcRunTerSim_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
      Value = uVar1;
      if (((ulong)pObj->pFanin0 & 1) != 0) {
        Value = 2;
        if (uVar1 != 1) {
          Value = (uint)(uVar1 != 2) * 2 + 1;
        }
      }
    }
    else {
      iVar2 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar2 == 0) {
        if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                        ,0x4d3,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        iVar3 = Saig_ManBmcRunTerSim_rec
                          (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
        iVar4 = Saig_ManBmcRunTerSim_rec
                          (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),iFrame);
        iVar2 = (uint)(iVar3 != 2) * 2 + 1;
        if (iVar3 == 1) {
          iVar2 = 2;
        }
        if (((ulong)pObj->pFanin0 & 1) == 0) {
          iVar2 = iVar3;
        }
        iVar3 = (uint)(iVar4 != 2) * 2 + 1;
        if (iVar4 == 1) {
          iVar3 = 2;
        }
        if (((ulong)pObj->pFanin1 & 1) == 0) {
          iVar3 = iVar4;
        }
        Value = (iVar3 == 2 && iVar2 == 2) ^ 3;
        if (iVar3 == 1) {
          Value = 1;
        }
        if (iVar2 == 1) {
          Value = 1;
        }
      }
      else {
        if (iFrame < 1) {
          __assert_fail("iFrame > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                        ,0x4c6,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        pObj_00 = Saig_ObjLoToLi(p->pAig,pObj);
        Value = Saig_ManBmcRunTerSim_rec(p,pObj_00,iFrame + -1);
      }
    }
    Saig_ManBmcSimInfoSet(pInfo,pObj,Value);
    piVar5 = Saig_ManBmcMapping(p,pObj);
    if ((Value != 3) && (piVar5 != (int *)0x0)) {
      Saig_ManBmcSetLiteral(p,pObj,iFrame,(uint)(Value == 2));
    }
  }
  return Value;
}

Assistant:

int Saig_ManBmcRunTerSim_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pInfo = (unsigned *)Vec_PtrEntry( p->vTerInfo, iFrame );
    int Val0, Val1, Value = Saig_ManBmcSimInfoGet( pInfo, pObj );
    if ( Value != SAIG_TER_NON )
    {
/*
        // check the value of this literal in the SAT solver
        if ( Value == SAIG_TER_UND && Saig_ManBmcMapping(p, pObj) )
        {
            int Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
            if ( Lit >= 0  )
            {
                assert( Lit >= 2 );
                if ( p->pSat->assigns[Abc_Lit2Var(Lit)] < 2 )
                {
                    p->nUniProps++;
                    if ( Abc_LitIsCompl(Lit) ^ (p->pSat->assigns[Abc_Lit2Var(Lit)] == 0) )
                        Value = SAIG_TER_ONE;
                    else
                        Value = SAIG_TER_ZER;

//                    Value = SAIG_TER_UND;  // disable!

                    // use the new value
                    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
                    // transfer to the unrolling
                    if ( Value != SAIG_TER_UND )
                        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
                }
            }
        }
*/
        return Value;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Value = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            Value = Saig_ManBmcSimInfoNot( Value );
    }
    else if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( iFrame > 0 );
        Value = Saig_ManBmcRunTerSim_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame - 1 );
    }
    else if ( Aig_ObjIsNode(pObj) )
    {
        Val0 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame  );
        Val1 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin1(pObj), iFrame  );
        if ( Aig_ObjFaninC0(pObj) )
            Val0 = Saig_ManBmcSimInfoNot( Val0 );
        if ( Aig_ObjFaninC1(pObj) )
            Val1 = Saig_ManBmcSimInfoNot( Val1 );
        Value = Saig_ManBmcSimInfoAnd( Val0, Val1 );
    }
    else assert( 0 );
    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
    // transfer to the unrolling
    if ( Saig_ManBmcMapping(p, pObj) && Value != SAIG_TER_UND )
        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
    return Value;
}